

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_compressBlock_fast_extDict_generic
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize,
                 U32 mls,U32 hasStep)

{
  uint uVar1;
  U32 *pUVar2;
  BYTE *pBVar3;
  BYTE *pBVar4;
  long lVar5;
  int iVar6;
  BYTE *pBVar7;
  U32 UVar8;
  uint uVar9;
  uint uVar10;
  U32 UVar11;
  uint uVar12;
  ulong uVar13;
  BYTE *pBVar14;
  BYTE *pBVar15;
  BYTE *pBVar16;
  size_t sVar17;
  ulong uVar18;
  long lVar19;
  BYTE *in_RCX;
  uint *in_RDX;
  void *dst;
  long *in_RSI;
  ZSTD_matchState_t *in_RDI;
  ulong uVar20;
  long in_R8;
  int in_R9D;
  bool bVar21;
  U32 tmpOffset;
  size_t repLength2;
  BYTE *repEnd2;
  BYTE *repMatch2;
  U32 repIndex2;
  BYTE *lowMatchPtr;
  U32 offset;
  U32 mval_1;
  U32 mval;
  U32 rval;
  BYTE *repBase;
  U32 repIndex;
  U32 current2;
  U32 maxRep;
  U32 curr;
  size_t kStepIncr;
  BYTE *nextStep;
  size_t step;
  BYTE *matchEnd;
  size_t mLength;
  BYTE *match0;
  U32 offcode;
  BYTE *idxBase;
  U32 idx;
  size_t hash1;
  size_t hash0;
  U32 current0;
  BYTE *ip3;
  BYTE *ip2;
  BYTE *ip1;
  BYTE *ip0;
  U32 offsetSaved2;
  U32 offsetSaved1;
  U32 offset_2;
  U32 offset_1;
  BYTE *ilimit;
  BYTE *iend;
  BYTE *dictEnd;
  BYTE *prefixStart;
  U32 prefixStartIndex;
  U32 dictLimit;
  BYTE *dictStart;
  U32 dictStartIndex;
  U32 lowLimit;
  U32 endIndex;
  BYTE *anchor;
  BYTE *istart;
  BYTE *dictBase;
  BYTE *base;
  size_t stepSize;
  U32 hlog;
  U32 *hashTable;
  ZSTD_compressionParameters *cParams;
  size_t mlBase_1;
  BYTE *litEnd_1;
  BYTE *litLimit_w_1;
  size_t mlBase;
  BYTE *litEnd;
  BYTE *litLimit_w;
  BYTE *oend;
  BYTE *op;
  BYTE *ip;
  ptrdiff_t diff;
  BYTE *oend_1;
  BYTE *op_1;
  BYTE *ip_1;
  ptrdiff_t diff_1;
  BYTE *in_stack_fffffffffffffbc8;
  undefined4 in_stack_fffffffffffffbd0;
  U32 in_stack_fffffffffffffbd4;
  U32 *in_stack_fffffffffffffbd8;
  BYTE *in_stack_fffffffffffffbe0;
  undefined4 in_stack_fffffffffffffbe8;
  U32 in_stack_fffffffffffffbec;
  seqStore_t *in_stack_fffffffffffffbf0;
  ZSTD_matchState_t *in_stack_fffffffffffffbf8;
  undefined4 in_stack_fffffffffffffc00;
  U32 in_stack_fffffffffffffc04;
  U32 *in_stack_fffffffffffffc08;
  BYTE *local_3d0;
  uint local_3bc;
  uint local_3b8;
  uint local_3b4;
  BYTE *local_3a8;
  U32 local_39c;
  BYTE *local_390;
  U32 local_384;
  BYTE *local_380;
  BYTE *local_378;
  BYTE *local_370;
  uint local_358;
  U32 local_31c;
  BYTE *local_2f8;
  ulong local_2f0;
  BYTE *local_2e8;
  long local_2e0;
  BYTE *local_2d8;
  int local_2cc;
  BYTE *local_2c8;
  uint local_2bc;
  size_t local_2b8;
  size_t local_2b0;
  U32 local_2a4;
  BYTE *local_2a0;
  BYTE *local_298;
  BYTE *local_290;
  BYTE *local_288;
  uint local_280;
  uint local_27c;
  uint local_278;
  uint local_274;
  BYTE *local_230;
  size_t local_1c0;
  size_t local_118;
  size_t local_100;
  size_t local_e8;
  size_t local_d0;
  size_t local_b8;
  size_t local_a0;
  size_t local_88;
  void *local_78;
  BYTE *local_70;
  
  pUVar2 = in_RDI->hashTable;
  uVar1 = (in_RDI->cParams).hashLog;
  uVar13 = (ulong)((in_RDI->cParams).targetLength +
                   (uint)(((in_RDI->cParams).targetLength != 0 ^ 0xffU) & 1) + 1);
  pBVar3 = (in_RDI->window).base;
  pBVar4 = (in_RDI->window).dictBase;
  iVar6 = (int)pBVar3;
  UVar8 = ZSTD_getLowestMatchIndex
                    (in_RDI,((int)in_RCX - iVar6) + (int)in_R8,(in_RDI->cParams).windowLog);
  local_358 = (in_RDI->window).dictLimit;
  if (local_358 < UVar8) {
    local_358 = UVar8;
  }
  pBVar14 = pBVar4 + local_358;
  pBVar15 = in_RCX + in_R8;
  pBVar16 = pBVar15 + -8;
  uVar10 = *in_RDX;
  uVar12 = in_RDX[1];
  local_27c = 0;
  local_280 = 0;
  if (local_358 == UVar8) {
    local_1c0 = ZSTD_compressBlock_fast
                          (in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,
                           (U32 *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                           in_stack_fffffffffffffbe0,(size_t)in_stack_fffffffffffffbd8);
  }
  else {
    uVar9 = ((int)in_RCX - iVar6) - UVar8;
    local_278 = uVar12;
    if (uVar9 <= uVar12) {
      local_278 = 0;
      local_280 = uVar12;
    }
    local_274 = uVar10;
    local_230 = in_RCX;
    if (uVar9 <= uVar10) {
      local_274 = 0;
      local_27c = uVar10;
    }
LAB_003346bf:
    local_288 = local_230;
    local_2f8 = local_230 + 0x80;
    local_290 = local_230 + 1;
    local_298 = local_230 + uVar13;
    local_2a0 = local_298 + 1;
    if (local_2a0 < pBVar16) {
      if (0x20 < uVar1) {
        __assert_fail("hBits <= 32",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x4730,"size_t ZSTD_hashPtr(const void *, U32, U32)");
      }
      UVar11 = (U32)((ulong)in_stack_fffffffffffffbc8 >> 0x20);
      switch(in_R9D) {
      default:
        local_88 = ZSTD_hash4Ptr((void *)CONCAT44(in_stack_fffffffffffffbd4,
                                                  in_stack_fffffffffffffbd0),UVar11);
        break;
      case 5:
        local_88 = ZSTD_hash5Ptr((void *)CONCAT44(in_stack_fffffffffffffbd4,
                                                  in_stack_fffffffffffffbd0),UVar11);
        break;
      case 6:
        local_88 = ZSTD_hash6Ptr((void *)CONCAT44(in_stack_fffffffffffffbd4,
                                                  in_stack_fffffffffffffbd0),UVar11);
        break;
      case 7:
        local_88 = ZSTD_hash7Ptr((void *)CONCAT44(in_stack_fffffffffffffbd4,
                                                  in_stack_fffffffffffffbd0),UVar11);
        break;
      case 8:
        local_88 = ZSTD_hash8Ptr((void *)CONCAT44(in_stack_fffffffffffffbd4,
                                                  in_stack_fffffffffffffbd0),UVar11);
      }
      local_2b0 = local_88;
      if (0x20 < uVar1) {
        __assert_fail("hBits <= 32",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x4730,"size_t ZSTD_hashPtr(const void *, U32, U32)");
      }
      UVar11 = (U32)((ulong)in_stack_fffffffffffffbc8 >> 0x20);
      switch(in_R9D) {
      default:
        local_a0 = ZSTD_hash4Ptr((void *)CONCAT44(in_stack_fffffffffffffbd4,
                                                  in_stack_fffffffffffffbd0),UVar11);
        break;
      case 5:
        local_a0 = ZSTD_hash5Ptr((void *)CONCAT44(in_stack_fffffffffffffbd4,
                                                  in_stack_fffffffffffffbd0),UVar11);
        break;
      case 6:
        local_a0 = ZSTD_hash6Ptr((void *)CONCAT44(in_stack_fffffffffffffbd4,
                                                  in_stack_fffffffffffffbd0),UVar11);
        break;
      case 7:
        local_a0 = ZSTD_hash7Ptr((void *)CONCAT44(in_stack_fffffffffffffbd4,
                                                  in_stack_fffffffffffffbd0),UVar11);
        break;
      case 8:
        local_a0 = ZSTD_hash8Ptr((void *)CONCAT44(in_stack_fffffffffffffbd4,
                                                  in_stack_fffffffffffffbd0),UVar11);
      }
      local_2b8 = local_a0;
      local_2bc = pUVar2[local_88];
      local_370 = pBVar3;
      if (local_2bc < local_358) {
        local_370 = pBVar4;
      }
      local_2c8 = local_370;
      local_2f0 = uVar13;
      while( true ) {
        pBVar7 = local_290;
        sVar17 = local_2b8;
        uVar10 = ((int)local_298 - iVar6) - local_274;
        local_378 = pBVar3;
        if (uVar10 < local_358) {
          local_378 = pBVar4;
        }
        if (local_358 - uVar10 < 4 || local_274 == 0) {
          local_31c = MEM_read32(local_298);
          local_31c = local_31c ^ 1;
        }
        else {
          local_31c = MEM_read32(local_378 + uVar10);
        }
        local_2a4 = (int)local_288 - iVar6;
        pUVar2[local_2b0] = local_2a4;
        UVar11 = MEM_read32(local_298);
        if (UVar11 == local_31c) {
          local_378 = local_378 + uVar10;
          local_380 = pBVar15;
          if (uVar10 < local_358) {
            local_380 = pBVar14;
          }
          local_2e8 = local_380;
          if (local_378 == pBVar3 + local_358 || local_378 == pBVar4 + UVar8) {
            __assert_fail("(match0 != prefixStart) & (match0 != dictStart)",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x72c6,
                          "size_t ZSTD_compressBlock_fast_extDict_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                         );
          }
          local_288 = local_298 + -(long)(int)(uint)(local_298[-1] == local_378[-1]);
          local_2cc = 1;
          local_2e0 = (long)(int)(uint)(local_298[-1] == local_378[-1]) + 4;
          goto LAB_00335420;
        }
        if (local_2bc < UVar8) {
          local_384 = MEM_read32(local_288);
          local_384 = local_384 ^ 1;
        }
        else {
          local_384 = MEM_read32(local_2c8 + local_2bc);
        }
        UVar11 = MEM_read32(local_288);
        if (UVar11 == local_384) break;
        local_2bc = pUVar2[local_2b8];
        local_390 = pBVar3;
        if (local_2bc < local_358) {
          local_390 = pBVar4;
        }
        local_2c8 = local_390;
        if (0x20 < uVar1) {
          __assert_fail("hBits <= 32",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x4730,"size_t ZSTD_hashPtr(const void *, U32, U32)");
        }
        UVar11 = (U32)((ulong)in_stack_fffffffffffffbc8 >> 0x20);
        switch(in_R9D) {
        default:
          local_b8 = ZSTD_hash4Ptr((void *)CONCAT44(in_stack_fffffffffffffbd4,
                                                    in_stack_fffffffffffffbd0),UVar11);
          break;
        case 5:
          local_b8 = ZSTD_hash5Ptr((void *)CONCAT44(in_stack_fffffffffffffbd4,
                                                    in_stack_fffffffffffffbd0),UVar11);
          break;
        case 6:
          local_b8 = ZSTD_hash6Ptr((void *)CONCAT44(in_stack_fffffffffffffbd4,
                                                    in_stack_fffffffffffffbd0),UVar11);
          break;
        case 7:
          local_b8 = ZSTD_hash7Ptr((void *)CONCAT44(in_stack_fffffffffffffbd4,
                                                    in_stack_fffffffffffffbd0),UVar11);
          break;
        case 8:
          local_b8 = ZSTD_hash8Ptr((void *)CONCAT44(in_stack_fffffffffffffbd4,
                                                    in_stack_fffffffffffffbd0),UVar11);
        }
        local_2b8 = local_b8;
        local_288 = local_290;
        local_290 = local_298;
        local_2a4 = (int)pBVar7 - iVar6;
        pUVar2[sVar17] = local_2a4;
        if (local_2bc < UVar8) {
          local_39c = MEM_read32(pBVar7);
          local_39c = local_39c ^ 1;
        }
        else {
          local_39c = MEM_read32(local_390 + local_2bc);
        }
        UVar11 = MEM_read32(pBVar7);
        if (UVar11 == local_39c) break;
        local_2bc = pUVar2[local_b8];
        local_3a8 = pBVar3;
        if (local_2bc < local_358) {
          local_3a8 = pBVar4;
        }
        local_2c8 = local_3a8;
        local_2b0 = local_b8;
        if (0x20 < uVar1) {
          __assert_fail("hBits <= 32",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x4730,"size_t ZSTD_hashPtr(const void *, U32, U32)");
        }
        UVar11 = (U32)((ulong)in_stack_fffffffffffffbc8 >> 0x20);
        switch(in_R9D) {
        default:
          local_d0 = ZSTD_hash4Ptr((void *)CONCAT44(in_stack_fffffffffffffbd4,
                                                    in_stack_fffffffffffffbd0),UVar11);
          break;
        case 5:
          local_d0 = ZSTD_hash5Ptr((void *)CONCAT44(in_stack_fffffffffffffbd4,
                                                    in_stack_fffffffffffffbd0),UVar11);
          break;
        case 6:
          local_d0 = ZSTD_hash6Ptr((void *)CONCAT44(in_stack_fffffffffffffbd4,
                                                    in_stack_fffffffffffffbd0),UVar11);
          break;
        case 7:
          local_d0 = ZSTD_hash7Ptr((void *)CONCAT44(in_stack_fffffffffffffbd4,
                                                    in_stack_fffffffffffffbd0),UVar11);
          break;
        case 8:
          local_d0 = ZSTD_hash8Ptr((void *)CONCAT44(in_stack_fffffffffffffbd4,
                                                    in_stack_fffffffffffffbd0),UVar11);
        }
        local_2b8 = local_d0;
        local_288 = local_298;
        local_290 = local_2a0;
        local_298 = local_298 + local_2f0;
        local_2a0 = local_2a0 + local_2f0;
        if (local_2f8 <= local_298) {
          local_2f0 = local_2f0 + 1;
          local_2f8 = local_2f8 + 0x80;
        }
        if (pBVar16 <= local_2a0) goto LAB_003351a6;
      }
      uVar10 = local_2a4 - local_2bc;
      local_3d0 = pBVar15;
      pBVar7 = pBVar3 + local_358;
      if (local_2bc < local_358) {
        local_3d0 = pBVar14;
        pBVar7 = pBVar4 + UVar8;
      }
      local_2e8 = local_3d0;
      local_2d8 = local_2c8 + local_2bc;
      local_278 = local_274;
      if (uVar10 == 0) {
        __assert_fail("(offset)>0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x7326,
                      "size_t ZSTD_compressBlock_fast_extDict_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                     );
      }
      local_2cc = uVar10 + 3;
      local_2e0 = 4;
      while( true ) {
        bVar21 = false;
        if (local_230 < local_288 && pBVar7 < local_2d8) {
          bVar21 = local_288[-1] == local_2d8[-1];
        }
        local_274 = uVar10;
        if (!bVar21) break;
        local_288 = local_288 + -1;
        local_2d8 = local_2d8 + -1;
        local_2e0 = local_2e0 + 1;
      }
LAB_00335420:
      if (local_2e8 == (BYTE *)0x0) {
        __assert_fail("matchEnd != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x7333,
                      "size_t ZSTD_compressBlock_fast_extDict_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                     );
      }
      sVar17 = ZSTD_count_2segments
                         ((BYTE *)in_stack_fffffffffffffc08,
                          (BYTE *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                          (BYTE *)in_stack_fffffffffffffbf8,(BYTE *)in_stack_fffffffffffffbf0,
                          (BYTE *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      uVar18 = sVar17 + local_2e0;
      uVar20 = (long)local_288 - (long)local_230;
      if ((ulong)in_RSI[7] <= (ulong)(in_RSI[1] - *in_RSI >> 3)) {
        __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x468b,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (0x20000 < (ulong)in_RSI[8]) {
        __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x468d,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if ((ulong)(in_RSI[2] + in_RSI[8]) < in_RSI[3] + uVar20) {
        __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x468e,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (pBVar15 < local_230 + uVar20) {
        __assert_fail("literals + litLength <= litLimit",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x468f,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (pBVar15 + -0x20 < local_230 + uVar20) {
        ZSTD_safecopyLiterals
                  (in_stack_fffffffffffffbe0,(BYTE *)in_stack_fffffffffffffbd8,
                   (BYTE *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                   in_stack_fffffffffffffbc8);
      }
      else {
        ZSTD_copy16((void *)in_RSI[3],local_230);
        if (0x10 < uVar20) {
          lVar5 = in_RSI[3];
          dst = (void *)(lVar5 + 0x10);
          lVar19 = (long)dst - (long)(local_230 + 0x10);
          if ((lVar19 < 0x10) && (-0x10 < lVar19)) {
            __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x36a6,
                          "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                         );
          }
          ZSTD_copy16(dst,local_230 + 0x10);
          if (0x10 < (long)(uVar20 - 0x10)) {
            local_78 = (void *)(lVar5 + 0x20);
            do {
              local_70 = local_230 + 0x20;
              ZSTD_copy16(local_78,local_70);
              ZSTD_copy16((void *)((long)local_78 + 0x10),local_230 + 0x30);
              local_78 = (void *)((long)local_78 + 0x20);
              local_230 = local_70;
            } while (local_78 < (void *)((long)dst + (uVar20 - 0x10)));
          }
        }
      }
      in_RSI[3] = uVar20 + in_RSI[3];
      if (0xffff < uVar20) {
        if ((int)in_RSI[9] != 0) {
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46a0,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        *(undefined4 *)(in_RSI + 9) = 1;
        *(int *)((long)in_RSI + 0x4c) = (int)(in_RSI[1] - *in_RSI >> 3);
      }
      *(short *)(in_RSI[1] + 4) = (short)uVar20;
      *(int *)in_RSI[1] = local_2cc;
      if (uVar18 < 3) {
        __assert_fail("matchLength >= MINMATCH",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x46aa,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (0xffff < uVar18 - 3) {
        if ((int)in_RSI[9] != 0) {
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46ad,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        *(undefined4 *)(in_RSI + 9) = 2;
        *(int *)((long)in_RSI + 0x4c) = (int)(in_RSI[1] - *in_RSI >> 3);
      }
      *(short *)(in_RSI[1] + 6) = (short)(uVar18 - 3);
      in_RSI[1] = in_RSI[1] + 8;
      local_230 = local_288 + uVar18;
      if (local_290 < local_230) {
        pUVar2[local_2b8] = (int)local_290 - iVar6;
      }
      if (local_230 <= pBVar16) {
        if (pBVar3 + (ulong)local_2a4 + 2 <= in_RCX) {
          __assert_fail("base+current0+2 > istart",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x7343,
                        "size_t ZSTD_compressBlock_fast_extDict_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                       );
        }
        if (0x20 < uVar1) {
          __assert_fail("hBits <= 32",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x4730,"size_t ZSTD_hashPtr(const void *, U32, U32)");
        }
        UVar11 = (U32)((ulong)in_stack_fffffffffffffbc8 >> 0x20);
        switch(in_R9D) {
        default:
          local_e8 = ZSTD_hash4Ptr((void *)CONCAT44(in_stack_fffffffffffffbd4,
                                                    in_stack_fffffffffffffbd0),UVar11);
          break;
        case 5:
          local_e8 = ZSTD_hash5Ptr((void *)CONCAT44(in_stack_fffffffffffffbd4,
                                                    in_stack_fffffffffffffbd0),UVar11);
          break;
        case 6:
          local_e8 = ZSTD_hash6Ptr((void *)CONCAT44(in_stack_fffffffffffffbd4,
                                                    in_stack_fffffffffffffbd0),UVar11);
          break;
        case 7:
          local_e8 = ZSTD_hash7Ptr((void *)CONCAT44(in_stack_fffffffffffffbd4,
                                                    in_stack_fffffffffffffbd0),UVar11);
          break;
        case 8:
          local_e8 = ZSTD_hash8Ptr((void *)CONCAT44(in_stack_fffffffffffffbd4,
                                                    in_stack_fffffffffffffbd0),UVar11);
        }
        pUVar2[local_e8] = local_2a4 + 2;
        in_stack_fffffffffffffc04 = ((int)local_230 + -2) - iVar6;
        if (0x20 < uVar1) {
          __assert_fail("hBits <= 32",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x4730,"size_t ZSTD_hashPtr(const void *, U32, U32)");
        }
        in_stack_fffffffffffffbf8 = (ZSTD_matchState_t *)(ulong)(in_R9D - 4);
        UVar11 = (U32)((ulong)in_stack_fffffffffffffbc8 >> 0x20);
        in_stack_fffffffffffffc08 = pUVar2;
        switch(in_stack_fffffffffffffbf8) {
        default:
          local_100 = ZSTD_hash4Ptr((void *)CONCAT44(in_stack_fffffffffffffbd4,
                                                     in_stack_fffffffffffffbd0),UVar11);
          break;
        case (ZSTD_matchState_t *)0x1:
          local_100 = ZSTD_hash5Ptr((void *)CONCAT44(in_stack_fffffffffffffbd4,
                                                     in_stack_fffffffffffffbd0),UVar11);
          break;
        case (ZSTD_matchState_t *)0x2:
          local_100 = ZSTD_hash6Ptr((void *)CONCAT44(in_stack_fffffffffffffbd4,
                                                     in_stack_fffffffffffffbd0),UVar11);
          break;
        case (ZSTD_matchState_t *)0x3:
          local_100 = ZSTD_hash7Ptr((void *)CONCAT44(in_stack_fffffffffffffbd4,
                                                     in_stack_fffffffffffffbd0),UVar11);
          break;
        case (ZSTD_matchState_t *)0x4:
          local_100 = ZSTD_hash8Ptr((void *)CONCAT44(in_stack_fffffffffffffbd4,
                                                     in_stack_fffffffffffffbd0),UVar11);
        }
        in_stack_fffffffffffffc08[local_100] = in_stack_fffffffffffffc04;
        for (; uVar10 = local_278, local_230 <= pBVar16; local_230 = local_230 + sVar17 + 4) {
          uVar12 = ((int)local_230 - iVar6) - local_278;
          if (uVar12 < local_358) {
            in_stack_fffffffffffffbf0 = (seqStore_t *)(pBVar4 + uVar12);
          }
          else {
            in_stack_fffffffffffffbf0 = (seqStore_t *)(pBVar3 + uVar12);
          }
          if ((local_358 - 1) - uVar12 < 3 || local_278 == 0) break;
          in_stack_fffffffffffffbec = MEM_read32(in_stack_fffffffffffffbf0);
          UVar11 = MEM_read32(local_230);
          if (in_stack_fffffffffffffbec != UVar11) break;
          in_stack_fffffffffffffbe0 = pBVar15;
          if (uVar12 < local_358) {
            in_stack_fffffffffffffbe0 = pBVar14;
          }
          sVar17 = ZSTD_count_2segments
                             ((BYTE *)in_stack_fffffffffffffc08,
                              (BYTE *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                              (BYTE *)in_stack_fffffffffffffbf8,(BYTE *)in_stack_fffffffffffffbf0,
                              (BYTE *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8))
          ;
          local_278 = local_274;
          local_274 = uVar10;
          if ((ulong)in_RSI[7] <= (ulong)(in_RSI[1] - *in_RSI >> 3)) {
            __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x468b,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (0x20000 < (ulong)in_RSI[8]) {
            __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x468d,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if ((ulong)(in_RSI[2] + in_RSI[8]) < (ulong)in_RSI[3]) {
            __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x468e,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (pBVar15 < local_230) {
            __assert_fail("literals + litLength <= litLimit",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x468f,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (pBVar15 + -0x20 < local_230) {
            ZSTD_safecopyLiterals
                      (in_stack_fffffffffffffbe0,(BYTE *)in_stack_fffffffffffffbd8,
                       (BYTE *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                       in_stack_fffffffffffffbc8);
          }
          else {
            ZSTD_copy16((void *)in_RSI[3],local_230);
          }
          in_RSI[3] = in_RSI[3];
          *(undefined2 *)(in_RSI[1] + 4) = 0;
          *(undefined4 *)in_RSI[1] = 1;
          if (sVar17 + 4 < 3) {
            __assert_fail("matchLength >= MINMATCH",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x46aa,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (0xffff < sVar17 + 1) {
            if ((int)in_RSI[9] != 0) {
              __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x46ad,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            *(undefined4 *)(in_RSI + 9) = 2;
            *(int *)((long)in_RSI + 0x4c) = (int)(in_RSI[1] - *in_RSI >> 3);
          }
          *(short *)(in_RSI[1] + 6) = (short)(sVar17 + 1);
          in_RSI[1] = in_RSI[1] + 8;
          in_stack_fffffffffffffbd4 = (int)local_230 - iVar6;
          if (0x20 < uVar1) {
            __assert_fail("hBits <= 32",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x4730,"size_t ZSTD_hashPtr(const void *, U32, U32)");
          }
          in_stack_fffffffffffffbc8 = (BYTE *)(ulong)(in_R9D - 4);
          in_stack_fffffffffffffbd8 = pUVar2;
          switch(in_stack_fffffffffffffbc8) {
          default:
            local_118 = ZSTD_hash4Ptr((void *)CONCAT44(in_stack_fffffffffffffbd4,
                                                       in_stack_fffffffffffffbd0),0);
            break;
          case (BYTE *)0x1:
            local_118 = ZSTD_hash5Ptr((void *)CONCAT44(in_stack_fffffffffffffbd4,
                                                       in_stack_fffffffffffffbd0),0);
            break;
          case (BYTE *)0x2:
            local_118 = ZSTD_hash6Ptr((void *)CONCAT44(in_stack_fffffffffffffbd4,
                                                       in_stack_fffffffffffffbd0),0);
            break;
          case (BYTE *)0x3:
            local_118 = ZSTD_hash7Ptr((void *)CONCAT44(in_stack_fffffffffffffbd4,
                                                       in_stack_fffffffffffffbd0),0);
            break;
          case (BYTE *)0x4:
            local_118 = ZSTD_hash8Ptr((void *)CONCAT44(in_stack_fffffffffffffbd4,
                                                       in_stack_fffffffffffffbd0),0);
          }
          in_stack_fffffffffffffbd8[local_118] = in_stack_fffffffffffffbd4;
        }
      }
      goto LAB_003346bf;
    }
LAB_003351a6:
    if ((local_27c == 0) || (local_274 == 0)) {
      local_3b4 = local_280;
    }
    else {
      local_3b4 = local_27c;
    }
    if (local_274 == 0) {
      local_3b8 = local_27c;
    }
    else {
      local_3b8 = local_274;
    }
    *in_RDX = local_3b8;
    if (local_278 == 0) {
      local_3bc = local_3b4;
    }
    else {
      local_3bc = local_278;
    }
    in_RDX[1] = local_3bc;
    local_1c0 = (long)pBVar15 - (long)local_230;
  }
  return local_1c0;
}

Assistant:

static size_t ZSTD_compressBlock_fast_extDict_generic(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize, U32 const mls, U32 const hasStep)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32* const hashTable = ms->hashTable;
    U32 const hlog = cParams->hashLog;
    /* support stepSize of 0 */
    size_t const stepSize = cParams->targetLength + !(cParams->targetLength) + 1;
    const BYTE* const base = ms->window.base;
    const BYTE* const dictBase = ms->window.dictBase;
    const BYTE* const istart = (const BYTE*)src;
    const BYTE* anchor = istart;
    const U32   endIndex = (U32)((size_t)(istart - base) + srcSize);
    const U32   lowLimit = ZSTD_getLowestMatchIndex(ms, endIndex, cParams->windowLog);
    const U32   dictStartIndex = lowLimit;
    const BYTE* const dictStart = dictBase + dictStartIndex;
    const U32   dictLimit = ms->window.dictLimit;
    const U32   prefixStartIndex = dictLimit < lowLimit ? lowLimit : dictLimit;
    const BYTE* const prefixStart = base + prefixStartIndex;
    const BYTE* const dictEnd = dictBase + prefixStartIndex;
    const BYTE* const iend = istart + srcSize;
    const BYTE* const ilimit = iend - 8;
    U32 offset_1=rep[0], offset_2=rep[1];
    U32 offsetSaved1 = 0, offsetSaved2 = 0;

    const BYTE* ip0 = istart;
    const BYTE* ip1;
    const BYTE* ip2;
    const BYTE* ip3;
    U32 current0;


    size_t hash0; /* hash for ip0 */
    size_t hash1; /* hash for ip1 */
    U32 idx; /* match idx for ip0 */
    const BYTE* idxBase; /* base pointer for idx */

    U32 offcode;
    const BYTE* match0;
    size_t mLength;
    const BYTE* matchEnd = 0; /* initialize to avoid warning, assert != 0 later */

    size_t step;
    const BYTE* nextStep;
    const size_t kStepIncr = (1 << (kSearchStrength - 1));

    (void)hasStep; /* not currently specialized on whether it's accelerated */

    DEBUGLOG(5, "ZSTD_compressBlock_fast_extDict_generic (offset_1=%u)", offset_1);

    /* switch to "regular" variant if extDict is invalidated due to maxDistance */
    if (prefixStartIndex == dictStartIndex)
        return ZSTD_compressBlock_fast(ms, seqStore, rep, src, srcSize);

    {   U32 const curr = (U32)(ip0 - base);
        U32 const maxRep = curr - dictStartIndex;
        if (offset_2 >= maxRep) offsetSaved2 = offset_2, offset_2 = 0;
        if (offset_1 >= maxRep) offsetSaved1 = offset_1, offset_1 = 0;
    }

    /* start each op */
_start: /* Requires: ip0 */

    step = stepSize;
    nextStep = ip0 + kStepIncr;

    /* calculate positions, ip0 - anchor == 0, so we skip step calc */
    ip1 = ip0 + 1;
    ip2 = ip0 + step;
    ip3 = ip2 + 1;

    if (ip3 >= ilimit) {
        goto _cleanup;
    }

    hash0 = ZSTD_hashPtr(ip0, hlog, mls);
    hash1 = ZSTD_hashPtr(ip1, hlog, mls);

    idx = hashTable[hash0];
    idxBase = idx < prefixStartIndex ? dictBase : base;

    do {
        {   /* load repcode match for ip[2] */
            U32 const current2 = (U32)(ip2 - base);
            U32 const repIndex = current2 - offset_1;
            const BYTE* const repBase = repIndex < prefixStartIndex ? dictBase : base;
            U32 rval;
            if ( ((U32)(prefixStartIndex - repIndex) >= 4) /* intentional underflow */
                 & (offset_1 > 0) ) {
                rval = MEM_read32(repBase + repIndex);
            } else {
                rval = MEM_read32(ip2) ^ 1; /* guaranteed to not match. */
            }

            /* write back hash table entry */
            current0 = (U32)(ip0 - base);
            hashTable[hash0] = current0;

            /* check repcode at ip[2] */
            if (MEM_read32(ip2) == rval) {
                ip0 = ip2;
                match0 = repBase + repIndex;
                matchEnd = repIndex < prefixStartIndex ? dictEnd : iend;
                assert((match0 != prefixStart) & (match0 != dictStart));
                mLength = ip0[-1] == match0[-1];
                ip0 -= mLength;
                match0 -= mLength;
                offcode = REPCODE1_TO_OFFBASE;
                mLength += 4;
                goto _match;
        }   }

        {   /* load match for ip[0] */
            U32 const mval = idx >= dictStartIndex ?
                    MEM_read32(idxBase + idx) :
                    MEM_read32(ip0) ^ 1; /* guaranteed not to match */

            /* check match at ip[0] */
            if (MEM_read32(ip0) == mval) {
                /* found a match! */
                goto _offset;
        }   }

        /* lookup ip[1] */
        idx = hashTable[hash1];
        idxBase = idx < prefixStartIndex ? dictBase : base;

        /* hash ip[2] */
        hash0 = hash1;
        hash1 = ZSTD_hashPtr(ip2, hlog, mls);

        /* advance to next positions */
        ip0 = ip1;
        ip1 = ip2;
        ip2 = ip3;

        /* write back hash table entry */
        current0 = (U32)(ip0 - base);
        hashTable[hash0] = current0;

        {   /* load match for ip[0] */
            U32 const mval = idx >= dictStartIndex ?
                    MEM_read32(idxBase + idx) :
                    MEM_read32(ip0) ^ 1; /* guaranteed not to match */

            /* check match at ip[0] */
            if (MEM_read32(ip0) == mval) {
                /* found a match! */
                goto _offset;
        }   }

        /* lookup ip[1] */
        idx = hashTable[hash1];
        idxBase = idx < prefixStartIndex ? dictBase : base;

        /* hash ip[2] */
        hash0 = hash1;
        hash1 = ZSTD_hashPtr(ip2, hlog, mls);

        /* advance to next positions */
        ip0 = ip1;
        ip1 = ip2;
        ip2 = ip0 + step;
        ip3 = ip1 + step;

        /* calculate step */
        if (ip2 >= nextStep) {
            step++;
            PREFETCH_L1(ip1 + 64);
            PREFETCH_L1(ip1 + 128);
            nextStep += kStepIncr;
        }
    } while (ip3 < ilimit);

_cleanup:
    /* Note that there are probably still a couple positions we could search.
     * However, it seems to be a meaningful performance hit to try to search
     * them. So let's not. */

    /* If offset_1 started invalid (offsetSaved1 != 0) and became valid (offset_1 != 0),
     * rotate saved offsets. See comment in ZSTD_compressBlock_fast_noDict for more context. */
    offsetSaved2 = ((offsetSaved1 != 0) && (offset_1 != 0)) ? offsetSaved1 : offsetSaved2;

    /* save reps for next block */
    rep[0] = offset_1 ? offset_1 : offsetSaved1;
    rep[1] = offset_2 ? offset_2 : offsetSaved2;

    /* Return the last literals size */
    return (size_t)(iend - anchor);

_offset: /* Requires: ip0, idx, idxBase */

    /* Compute the offset code. */
    {   U32 const offset = current0 - idx;
        const BYTE* const lowMatchPtr = idx < prefixStartIndex ? dictStart : prefixStart;
        matchEnd = idx < prefixStartIndex ? dictEnd : iend;
        match0 = idxBase + idx;
        offset_2 = offset_1;
        offset_1 = offset;
        offcode = OFFSET_TO_OFFBASE(offset);
        mLength = 4;

        /* Count the backwards match length. */
        while (((ip0>anchor) & (match0>lowMatchPtr)) && (ip0[-1] == match0[-1])) {
            ip0--;
            match0--;
            mLength++;
    }   }

_match: /* Requires: ip0, match0, offcode, matchEnd */

    /* Count the forward length. */
    assert(matchEnd != 0);
    mLength += ZSTD_count_2segments(ip0 + mLength, match0 + mLength, iend, matchEnd, prefixStart);

    ZSTD_storeSeq(seqStore, (size_t)(ip0 - anchor), anchor, iend, offcode, mLength);

    ip0 += mLength;
    anchor = ip0;

    /* write next hash table entry */
    if (ip1 < ip0) {
        hashTable[hash1] = (U32)(ip1 - base);
    }

    /* Fill table and check for immediate repcode. */
    if (ip0 <= ilimit) {
        /* Fill Table */
        assert(base+current0+2 > istart);  /* check base overflow */
        hashTable[ZSTD_hashPtr(base+current0+2, hlog, mls)] = current0+2;  /* here because current+2 could be > iend-8 */
        hashTable[ZSTD_hashPtr(ip0-2, hlog, mls)] = (U32)(ip0-2-base);

        while (ip0 <= ilimit) {
            U32 const repIndex2 = (U32)(ip0-base) - offset_2;
            const BYTE* const repMatch2 = repIndex2 < prefixStartIndex ? dictBase + repIndex2 : base + repIndex2;
            if ( (((U32)((prefixStartIndex-1) - repIndex2) >= 3) & (offset_2 > 0))  /* intentional underflow */
                 && (MEM_read32(repMatch2) == MEM_read32(ip0)) ) {
                const BYTE* const repEnd2 = repIndex2 < prefixStartIndex ? dictEnd : iend;
                size_t const repLength2 = ZSTD_count_2segments(ip0+4, repMatch2+4, iend, repEnd2, prefixStart) + 4;
                { U32 const tmpOffset = offset_2; offset_2 = offset_1; offset_1 = tmpOffset; }  /* swap offset_2 <=> offset_1 */
                ZSTD_storeSeq(seqStore, 0 /*litlen*/, anchor, iend, REPCODE1_TO_OFFBASE, repLength2);
                hashTable[ZSTD_hashPtr(ip0, hlog, mls)] = (U32)(ip0-base);
                ip0 += repLength2;
                anchor = ip0;
                continue;
            }
            break;
    }   }

    goto _start;
}